

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::HlslParseContext::parseShaderStrings
          (HlslParseContext *this,TPpContext *ppContext,TInputScanner *input,bool versionWillBeError
          )

{
  TInfoSink *this_00;
  bool bVar1;
  TSourceLoc *this_01;
  char *s;
  TInfoSinkBase *pTVar2;
  TSourceLoc *sourceLoc;
  HlslGrammar grammar;
  HlslScanContext scanContext;
  bool versionWillBeError_local;
  TInputScanner *input_local;
  TPpContext *ppContext_local;
  HlslParseContext *this_local;
  
  (this->super_TParseContextBase).super_TParseVersions.currentScanner = input;
  TPpContext::setInput(ppContext,input,versionWillBeError);
  HlslScanContext::HlslScanContext
            ((HlslScanContext *)&grammar.unitNode,&this->super_TParseContextBase,ppContext);
  HlslGrammar::HlslGrammar((HlslGrammar *)&sourceLoc,(HlslScanContext *)&grammar.unitNode,this);
  bVar1 = HlslGrammar::parse((HlslGrammar *)&sourceLoc);
  if (bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x50])();
    this_local._7_1_ = (this->super_TParseContextBase).super_TParseVersions.numErrors == 0;
  }
  else {
    this_01 = TInputScanner::getSourceLoc(input);
    this_00 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
    s = TSourceLoc::getFilenameStr(this_01);
    pTVar2 = TInfoSinkBase::operator<<(&this_00->info,s);
    pTVar2 = TInfoSinkBase::operator<<(pTVar2,"(");
    pTVar2 = TInfoSinkBase::operator<<(pTVar2,this_01->line);
    pTVar2 = TInfoSinkBase::operator<<(pTVar2,"): error at column ");
    pTVar2 = TInfoSinkBase::operator<<(pTVar2,this_01->column);
    TInfoSinkBase::operator<<(pTVar2,", HLSL parsing failed.\n");
    (this->super_TParseContextBase).super_TParseVersions.numErrors =
         (this->super_TParseContextBase).super_TParseVersions.numErrors + 1;
    this_local._7_1_ = false;
  }
  HlslGrammar::~HlslGrammar((HlslGrammar *)&sourceLoc);
  HlslScanContext::~HlslScanContext((HlslScanContext *)&grammar.unitNode);
  return this_local._7_1_;
}

Assistant:

bool HlslParseContext::parseShaderStrings(TPpContext& ppContext, TInputScanner& input, bool versionWillBeError)
{
    currentScanner = &input;
    ppContext.setInput(input, versionWillBeError);

    HlslScanContext scanContext(*this, ppContext);
    HlslGrammar grammar(scanContext, *this);
    if (!grammar.parse()) {
        // Print a message formated such that if you click on the message it will take you right to
        // the line through most UIs.
        const glslang::TSourceLoc& sourceLoc = input.getSourceLoc();
        infoSink.info << sourceLoc.getFilenameStr() << "(" << sourceLoc.line << "): error at column " << sourceLoc.column
                      << ", HLSL parsing failed.\n";
        ++numErrors;
        return false;
    }

    finish();

    return numErrors == 0;
}